

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm_x86.cpp
# Opt level: O1

int __thiscall
ncnn::GroupNorm_x86::forward_inplace(GroupNorm_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  ulong uVar2;
  float fVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  float *pfVar14;
  long lVar15;
  long lVar16;
  float *pfVar17;
  float *pfVar18;
  uint uVar19;
  ulong uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  __m128 _scale2;
  float fVar27;
  
  iVar10 = bottom_top_blob->dims;
  uVar2 = (long)(this->super_GroupNorm).channels / (long)(this->super_GroupNorm).group;
  uVar7 = uVar2 & 0xffffffff;
  uVar6 = (uint)uVar2;
  if (iVar10 == 2) {
    if (0 < (this->super_GroupNorm).group) {
      uVar4 = bottom_top_blob->w;
      uVar12 = uVar4 * uVar6;
      uVar11 = uVar12 & 0xfffffffc;
      lVar13 = 0;
      do {
        lVar16 = lVar13 * (int)uVar6;
        pfVar14 = (float *)(bottom_top_blob->w * lVar16 * bottom_top_blob->elemsize +
                           (long)bottom_top_blob->data);
        fVar21 = 0.0;
        fVar23 = 0.0;
        fVar24 = 0.0;
        fVar25 = 0.0;
        pfVar17 = pfVar14;
        fVar22 = 0.0;
        fVar26 = 0.0;
        uVar9 = 0;
        if (3 < (int)uVar12) {
          iVar10 = 3;
          do {
            fVar21 = fVar21 + *pfVar17;
            fVar23 = fVar23 + pfVar17[1];
            fVar24 = fVar24 + pfVar17[2];
            fVar25 = fVar25 + pfVar17[3];
            pfVar17 = pfVar17 + 4;
            iVar10 = iVar10 + 4;
            fVar22 = fVar21;
            fVar26 = fVar24;
            uVar9 = uVar11;
          } while (iVar10 < (int)uVar12);
        }
        fVar22 = fVar25 + fVar23 + fVar26 + fVar22;
        if (uVar12 - uVar9 != 0 && (int)uVar9 <= (int)uVar12) {
          lVar8 = 0;
          do {
            fVar22 = fVar22 + pfVar17[lVar8];
            lVar8 = lVar8 + 1;
          } while (uVar12 - uVar9 != (int)lVar8);
        }
        fVar22 = fVar22 * (1.0 / (float)(int)uVar12);
        pfVar17 = pfVar14;
        if ((int)uVar12 < 4) {
          fVar26 = 0.0;
          fVar21 = 0.0;
          fVar23 = 0.0;
          fVar24 = 0.0;
          uVar9 = 0;
        }
        else {
          fVar26 = 0.0;
          fVar21 = 0.0;
          fVar23 = 0.0;
          fVar24 = 0.0;
          iVar10 = 3;
          do {
            fVar26 = fVar26 + (*pfVar17 - fVar22) * (*pfVar17 - fVar22);
            fVar21 = fVar21 + (pfVar17[1] - fVar22) * (pfVar17[1] - fVar22);
            fVar23 = fVar23 + (pfVar17[2] - fVar22) * (pfVar17[2] - fVar22);
            fVar24 = fVar24 + (pfVar17[3] - fVar22) * (pfVar17[3] - fVar22);
            pfVar17 = pfVar17 + 4;
            iVar10 = iVar10 + 4;
            uVar9 = uVar11;
          } while (iVar10 < (int)uVar12);
        }
        fVar26 = fVar24 + fVar21 + fVar23 + fVar26;
        if (uVar12 - uVar9 != 0 && (int)uVar9 <= (int)uVar12) {
          lVar8 = 0;
          do {
            fVar26 = fVar26 + (pfVar17[lVar8] - fVar22) * (pfVar17[lVar8] - fVar22);
            lVar8 = lVar8 + 1;
          } while (uVar12 - uVar9 != (int)lVar8);
        }
        fVar26 = 1.0 / SQRT(fVar26 * (1.0 / (float)(int)uVar12) + (this->super_GroupNorm).eps);
        fVar22 = -fVar22 * fVar26;
        if ((this->super_GroupNorm).affine == 0) {
          uVar9 = 0;
          if (3 < (int)uVar12) {
            iVar10 = 3;
            do {
              *pfVar14 = *pfVar14 * fVar26 + fVar22;
              pfVar14[1] = pfVar14[1] * fVar26 + fVar22;
              pfVar14[2] = pfVar14[2] * fVar26 + fVar22;
              pfVar14[3] = pfVar14[3] * fVar26 + fVar22;
              pfVar14 = pfVar14 + 4;
              iVar10 = iVar10 + 4;
              uVar9 = uVar11;
            } while (iVar10 < (int)uVar12);
          }
          if (uVar12 - uVar9 != 0 && (int)uVar9 <= (int)uVar12) {
            lVar16 = 0;
            do {
              pfVar14[lVar16] = pfVar14[lVar16] * fVar26 + fVar22;
              lVar16 = lVar16 + 1;
            } while (uVar12 - uVar9 != (int)lVar16);
          }
        }
        else if (0 < (int)uVar6) {
          pfVar18 = (float *)((this->super_GroupNorm).gamma_data.elemsize * lVar16 +
                             (long)(this->super_GroupNorm).gamma_data.data);
          pfVar17 = (float *)(lVar16 * (this->super_GroupNorm).beta_data.elemsize +
                             (long)(this->super_GroupNorm).beta_data.data);
          uVar9 = 0;
          do {
            fVar23 = *pfVar18 * fVar26;
            fVar21 = *pfVar18 * fVar22 + *pfVar17;
            if ((int)uVar4 < 4) {
              uVar19 = 0;
            }
            else {
              iVar10 = 3;
              do {
                *pfVar14 = *pfVar14 * fVar23 + fVar21;
                pfVar14[1] = pfVar14[1] * fVar23 + fVar21;
                pfVar14[2] = pfVar14[2] * fVar23 + fVar21;
                pfVar14[3] = pfVar14[3] * fVar23 + fVar21;
                pfVar14 = pfVar14 + 4;
                iVar10 = iVar10 + 4;
                uVar19 = uVar4 & 0xfffffffc;
              } while (iVar10 < (int)uVar4);
            }
            iVar10 = uVar4 - uVar19;
            if (iVar10 != 0 && (int)uVar19 <= (int)uVar4) {
              do {
                *pfVar14 = *pfVar14 * fVar23 + fVar21;
                pfVar14 = pfVar14 + 1;
                iVar10 = iVar10 + -1;
              } while (iVar10 != 0);
            }
            pfVar18 = pfVar18 + 1;
            pfVar17 = pfVar17 + 1;
            uVar9 = uVar9 + 1;
          } while (uVar9 != uVar6);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < (this->super_GroupNorm).group);
    }
  }
  else if (iVar10 == 1) {
    if (0 < (this->super_GroupNorm).group) {
      uVar4 = uVar6 & 0xfffffffc;
      lVar13 = 0;
      do {
        lVar16 = lVar13 * (int)uVar6;
        pfVar14 = (float *)(bottom_top_blob->elemsize * lVar16 + (long)bottom_top_blob->data);
        fVar21 = 0.0;
        fVar23 = 0.0;
        fVar24 = 0.0;
        fVar25 = 0.0;
        pfVar17 = pfVar14;
        fVar22 = 0.0;
        fVar26 = 0.0;
        uVar12 = 0;
        if (3 < (int)uVar6) {
          iVar10 = 3;
          do {
            fVar21 = fVar21 + *pfVar17;
            fVar23 = fVar23 + pfVar17[1];
            fVar24 = fVar24 + pfVar17[2];
            fVar25 = fVar25 + pfVar17[3];
            pfVar17 = pfVar17 + 4;
            iVar10 = iVar10 + 4;
            fVar22 = fVar21;
            fVar26 = fVar24;
            uVar12 = uVar4;
          } while (iVar10 < (int)uVar6);
        }
        fVar22 = fVar25 + fVar23 + fVar26 + fVar22;
        if ((int)uVar12 < (int)uVar6) {
          lVar8 = 0;
          do {
            fVar22 = fVar22 + pfVar17[lVar8];
            lVar8 = lVar8 + 1;
          } while (uVar6 - uVar12 != (int)lVar8);
        }
        fVar22 = fVar22 * (1.0 / (float)(int)uVar6);
        pfVar17 = pfVar14;
        if ((int)uVar6 < 4) {
          fVar26 = 0.0;
          fVar21 = 0.0;
          fVar23 = 0.0;
          fVar24 = 0.0;
          uVar12 = 0;
        }
        else {
          fVar26 = 0.0;
          fVar21 = 0.0;
          fVar23 = 0.0;
          fVar24 = 0.0;
          iVar10 = 3;
          do {
            fVar26 = fVar26 + (*pfVar17 - fVar22) * (*pfVar17 - fVar22);
            fVar21 = fVar21 + (pfVar17[1] - fVar22) * (pfVar17[1] - fVar22);
            fVar23 = fVar23 + (pfVar17[2] - fVar22) * (pfVar17[2] - fVar22);
            fVar24 = fVar24 + (pfVar17[3] - fVar22) * (pfVar17[3] - fVar22);
            pfVar17 = pfVar17 + 4;
            iVar10 = iVar10 + 4;
            uVar12 = uVar4;
          } while (iVar10 < (int)uVar6);
        }
        fVar26 = fVar24 + fVar21 + fVar23 + fVar26;
        if ((int)uVar12 < (int)uVar6) {
          lVar8 = 0;
          do {
            fVar26 = fVar26 + (pfVar17[lVar8] - fVar22) * (pfVar17[lVar8] - fVar22);
            lVar8 = lVar8 + 1;
          } while (uVar6 - uVar12 != (int)lVar8);
        }
        fVar26 = 1.0 / SQRT(fVar26 * (1.0 / (float)(int)uVar6) + (this->super_GroupNorm).eps);
        fVar22 = -fVar22 * fVar26;
        if ((this->super_GroupNorm).affine == 0) {
          uVar12 = 0;
          if (3 < (int)uVar6) {
            iVar10 = 3;
            do {
              *pfVar14 = *pfVar14 * fVar26 + fVar22;
              pfVar14[1] = pfVar14[1] * fVar26 + fVar22;
              pfVar14[2] = pfVar14[2] * fVar26 + fVar22;
              pfVar14[3] = pfVar14[3] * fVar26 + fVar22;
              pfVar14 = pfVar14 + 4;
              iVar10 = iVar10 + 4;
              uVar12 = uVar4;
            } while (iVar10 < (int)uVar6);
          }
          if ((int)uVar12 < (int)uVar6) {
            lVar16 = 0;
            do {
              pfVar14[lVar16] = pfVar14[lVar16] * fVar26 + fVar22;
              lVar16 = lVar16 + 1;
            } while (uVar6 - uVar12 != (int)lVar16);
          }
        }
        else {
          pfVar18 = (float *)((this->super_GroupNorm).gamma_data.elemsize * lVar16 +
                             (long)(this->super_GroupNorm).gamma_data.data);
          pfVar17 = (float *)(lVar16 * (this->super_GroupNorm).beta_data.elemsize +
                             (long)(this->super_GroupNorm).beta_data.data);
          uVar12 = 0;
          if (3 < (int)uVar6) {
            iVar10 = 3;
            do {
              fVar21 = pfVar18[1];
              fVar23 = pfVar18[2];
              fVar24 = pfVar18[3];
              fVar25 = pfVar17[1];
              fVar27 = pfVar17[2];
              fVar3 = pfVar17[3];
              *pfVar14 = (*pfVar14 * fVar26 + fVar22) * *pfVar18 + *pfVar17;
              pfVar14[1] = (pfVar14[1] * fVar26 + fVar22) * fVar21 + fVar25;
              pfVar14[2] = (pfVar14[2] * fVar26 + fVar22) * fVar23 + fVar27;
              pfVar14[3] = (pfVar14[3] * fVar26 + fVar22) * fVar24 + fVar3;
              pfVar18 = pfVar18 + 4;
              pfVar17 = pfVar17 + 4;
              pfVar14 = pfVar14 + 4;
              iVar10 = iVar10 + 4;
              uVar12 = uVar4;
            } while (iVar10 < (int)uVar6);
          }
          if ((int)uVar12 < (int)uVar6) {
            lVar16 = 0;
            do {
              pfVar14[lVar16] =
                   (pfVar14[lVar16] * fVar26 + fVar22) * pfVar18[lVar16] + pfVar17[lVar16];
              lVar16 = lVar16 + 1;
            } while (uVar6 - uVar12 != (int)lVar16);
          }
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < (this->super_GroupNorm).group);
    }
  }
  else if ((iVar10 - 3U < 2) && (0 < (this->super_GroupNorm).group)) {
    uVar12 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    uVar4 = uVar12 & 0xfffffffc;
    fVar22 = 1.0 / (float)(int)(uVar12 * uVar6);
    lVar13 = 0;
    do {
      lVar16 = lVar13 * (int)uVar6;
      uVar2 = bottom_top_blob->elemsize;
      lVar8 = bottom_top_blob->cstep * lVar16 * uVar2;
      pvVar1 = bottom_top_blob->data;
      uVar5 = ((long)bottom_top_blob->d * uVar2 *
               (long)bottom_top_blob->h * (long)bottom_top_blob->w + 0xf & 0xfffffffffffffff0) /
              uVar2;
      fVar21 = 0.0;
      fVar26 = 0.0;
      if (0 < (int)uVar6) {
        fVar26 = 0.0;
        uVar20 = 0;
        do {
          pfVar17 = (float *)((long)pvVar1 + uVar5 * uVar2 * uVar20 + lVar8);
          if ((int)uVar12 < 4) {
            fVar23 = 0.0;
            fVar24 = 0.0;
            fVar25 = 0.0;
            fVar27 = 0.0;
            uVar11 = 0;
          }
          else {
            fVar23 = 0.0;
            fVar24 = 0.0;
            fVar25 = 0.0;
            fVar27 = 0.0;
            iVar10 = 3;
            do {
              fVar23 = fVar23 + *pfVar17;
              fVar24 = fVar24 + pfVar17[1];
              fVar25 = fVar25 + pfVar17[2];
              fVar27 = fVar27 + pfVar17[3];
              pfVar17 = pfVar17 + 4;
              iVar10 = iVar10 + 4;
              uVar11 = uVar4;
            } while (iVar10 < (int)uVar12);
          }
          fVar26 = fVar27 + fVar24 + fVar26 + fVar25 + fVar23;
          if (uVar12 - uVar11 != 0 && (int)uVar11 <= (int)uVar12) {
            lVar15 = 0;
            do {
              fVar26 = fVar26 + pfVar17[lVar15];
              lVar15 = lVar15 + 1;
            } while (uVar12 - uVar11 != (int)lVar15);
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar7);
      }
      pfVar17 = (float *)((this->super_GroupNorm).gamma_data.elemsize * lVar16 +
                         (long)(this->super_GroupNorm).gamma_data.data);
      pfVar14 = (float *)(lVar16 * (this->super_GroupNorm).beta_data.elemsize +
                         (long)(this->super_GroupNorm).beta_data.data);
      fVar26 = fVar26 * fVar22;
      if (0 < (int)uVar6) {
        fVar21 = 0.0;
        uVar20 = 0;
        do {
          pfVar18 = (float *)((long)pvVar1 + uVar5 * uVar2 * uVar20 + lVar8);
          if ((int)uVar12 < 4) {
            fVar23 = 0.0;
            fVar24 = 0.0;
            fVar25 = 0.0;
            fVar27 = 0.0;
            uVar11 = 0;
          }
          else {
            fVar23 = 0.0;
            fVar24 = 0.0;
            fVar25 = 0.0;
            fVar27 = 0.0;
            iVar10 = 3;
            do {
              fVar23 = fVar23 + (*pfVar18 - fVar26) * (*pfVar18 - fVar26);
              fVar24 = fVar24 + (pfVar18[1] - fVar26) * (pfVar18[1] - fVar26);
              fVar25 = fVar25 + (pfVar18[2] - fVar26) * (pfVar18[2] - fVar26);
              fVar27 = fVar27 + (pfVar18[3] - fVar26) * (pfVar18[3] - fVar26);
              pfVar18 = pfVar18 + 4;
              iVar10 = iVar10 + 4;
              uVar11 = uVar4;
            } while (iVar10 < (int)uVar12);
          }
          fVar21 = fVar27 + fVar24 + fVar21 + fVar25 + fVar23;
          if (uVar12 - uVar11 != 0 && (int)uVar11 <= (int)uVar12) {
            lVar16 = 0;
            do {
              fVar21 = fVar21 + (pfVar18[lVar16] - fVar26) * (pfVar18[lVar16] - fVar26);
              lVar16 = lVar16 + 1;
            } while (uVar12 - uVar11 != (int)lVar16);
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar7);
      }
      if (0 < (int)uVar6) {
        fVar21 = 1.0 / SQRT(fVar21 * fVar22 + (this->super_GroupNorm).eps);
        uVar20 = 0;
        do {
          fVar24 = -fVar26 * fVar21;
          fVar23 = fVar21;
          if ((this->super_GroupNorm).affine != 0) {
            fVar23 = *pfVar17 * fVar21;
            fVar24 = *pfVar17 * -fVar26 * fVar21 + *pfVar14;
          }
          pfVar18 = (float *)((long)pvVar1 + uVar5 * uVar2 * uVar20 + lVar8);
          uVar11 = 0;
          if (3 < (int)uVar12) {
            iVar10 = 3;
            do {
              *pfVar18 = *pfVar18 * fVar23 + fVar24;
              pfVar18[1] = pfVar18[1] * fVar23 + fVar24;
              pfVar18[2] = pfVar18[2] * fVar23 + fVar24;
              pfVar18[3] = pfVar18[3] * fVar23 + fVar24;
              pfVar18 = pfVar18 + 4;
              iVar10 = iVar10 + 4;
              uVar11 = uVar4;
            } while (iVar10 < (int)uVar12);
          }
          if (uVar12 - uVar11 != 0 && (int)uVar11 <= (int)uVar12) {
            lVar16 = 0;
            do {
              pfVar18[lVar16] = pfVar18[lVar16] * fVar23 + fVar24;
              lVar16 = lVar16 + 1;
            } while (uVar12 - uVar11 != (int)lVar16);
          }
          pfVar17 = pfVar17 + 1;
          pfVar14 = pfVar14 + 1;
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar7);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < (this->super_GroupNorm).group);
  }
  return 0;
}

Assistant:

int GroupNorm_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    const int dims = bottom_top_blob.dims;
    const int channels_per_group = channels / group;

    if (dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < channels_per_group; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < channels_per_group; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < channels_per_group; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / channels_per_group;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / channels_per_group + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                int i = 0;
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _gamma = _mm512_loadu_ps(gamma);
                    __m512 _beta = _mm512_loadu_ps(beta);
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _a = _mm512_mul_ps(_gamma, _scale1_avx512);
                    __m512 _b = _mm512_add_ps(_mm512_mul_ps(_gamma, _scale2_avx512), _beta);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a), _b);
                    _mm512_storeu_ps(ptr, _p);
                    gamma += 16;
                    beta += 16;
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _gamma = _mm256_loadu_ps(gamma);
                    __m256 _beta = _mm256_loadu_ps(beta);
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _a = _mm256_mul_ps(_gamma, _scale1_avx);
                    __m256 _b = _mm256_comp_fmadd_ps(_gamma, _scale2_avx, _beta);
                    _p = _mm256_comp_fmadd_ps(_p, _a, _b);
                    _mm256_storeu_ps(ptr, _p);
                    gamma += 8;
                    beta += 8;
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _gamma = _mm_loadu_ps(gamma);
                    __m128 _beta = _mm_loadu_ps(beta);
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _a = _mm_mul_ps(_gamma, _scale1);
                    __m128 _b = _mm_comp_fmadd_ps(_gamma, _scale2, _beta);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    gamma += 4;
                    beta += 4;
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    *ptr = *ptr * a + b;
                    gamma++;
                    beta++;
                    ptr++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int size = channels_per_group * w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.row_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / size;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / size + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
                for (int q = 0; q < channels_per_group; q++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _a_avx512 = _mm512_set1_ps(a);
                    __m512 _b_avx512 = _mm512_set1_ps(b);
                    for (; i + 15 < w; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                        _mm512_storeu_ps(ptr, _p);
                        ptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _a_avx = _mm256_set1_ps(a);
                    __m256 _b_avx = _mm256_set1_ps(b);
                    for (; i + 7 < w; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                        _mm256_storeu_ps(ptr, _p);
                        ptr += 8;
                    }
#endif // __AVX__
                    __m128 _a = _mm_set1_ps(a);
                    __m128 _b = _mm_set1_ps(b);
                    for (; i + 3 < w; i += 4)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_comp_fmadd_ps(_p, _a, _b);
                        _mm_storeu_ps(ptr, _p);
                        ptr += 4;
                    }
#endif // __SSE2__
                    for (; i < w; i++)
                    {
                        *ptr = *ptr * a + b;
                        ptr++;
                    }
                    gamma++;
                    beta++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 3 || dims == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int d = bottom_top_blob.d;
        int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.channel_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / (channels_per_group * size);

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / (channels_per_group * size) + eps);
            float scale2 = -mean * scale1;

            const float* gamma = gamma_data_g;
            const float* beta = beta_data_g;
            for (int q = 0; q < channels_per_group; q++)
            {
                float a = scale1;
                float b = scale2;
                if (affine)
                {
                    a = *gamma * a;
                    b = *gamma * b + *beta;
                }

                float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _a_avx512 = _mm512_set1_ps(a);
                __m512 _b_avx512 = _mm512_set1_ps(b);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _a_avx = _mm256_set1_ps(a);
                __m256 _b_avx = _mm256_set1_ps(b);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _a = _mm_set1_ps(a);
                __m128 _b = _mm_set1_ps(b);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * a + b;
                    ptr++;
                }

                gamma++;
                beta++;
            }
        }

        return 0;
    }

    return 0;
}